

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int autoIncBegin(Parse *pParse,int iDb,Table *pTab)

{
  int iVar1;
  sqlite3 *db;
  Table *pTVar2;
  AutoincInfo *pPtr;
  int iVar3;
  Parse *pParse_00;
  
  iVar3 = 0;
  if (((pTab->tabFlags & 8) != 0) && (db = pParse->db, iVar3 = 0, (db->mDbFlags & 4) == 0)) {
    pParse_00 = pParse->pToplevel;
    if (pParse->pToplevel == (Parse *)0x0) {
      pParse_00 = pParse;
    }
    pTVar2 = (db->aDb[iDb].pSchema)->pSeqTab;
    if ((((pTVar2 == (Table *)0x0) || ((pTVar2->tabFlags & 0x80) != 0)) ||
        (pTVar2->eTabType == '\x01')) || (pTVar2->nCol != 2)) {
      pParse->nErr = pParse->nErr + 1;
      pParse->rc = 0x20b;
    }
    else {
      pPtr = (AutoincInfo *)&pParse_00->pAinc;
      do {
        pPtr = pPtr->pNext;
        if (pPtr == (AutoincInfo *)0x0) {
          pPtr = (AutoincInfo *)sqlite3DbMallocRawNN(db,0x18);
          sqlite3ParserAddCleanup(pParse_00,sqlite3DbFree,pPtr);
          if (pParse->db->mallocFailed != '\0') {
            return 0;
          }
          pPtr->pNext = pParse_00->pAinc;
          pParse_00->pAinc = pPtr;
          pPtr->pTab = pTab;
          pPtr->iDb = iDb;
          iVar1 = pParse_00->nMem;
          iVar3 = iVar1 + 2;
          pParse_00->nMem = iVar3;
          pPtr->regCtr = iVar3;
          pParse_00->nMem = iVar1 + 4;
          break;
        }
      } while (pPtr->pTab != pTab);
      iVar3 = pPtr->regCtr;
    }
  }
  return iVar3;
}

Assistant:

static int autoIncBegin(
  Parse *pParse,      /* Parsing context */
  int iDb,            /* Index of the database holding pTab */
  Table *pTab         /* The table we are writing to */
){
  int memId = 0;      /* Register holding maximum rowid */
  assert( pParse->db->aDb[iDb].pSchema!=0 );
  if( (pTab->tabFlags & TF_Autoincrement)!=0
   && (pParse->db->mDbFlags & DBFLAG_Vacuum)==0
  ){
    Parse *pToplevel = sqlite3ParseToplevel(pParse);
    AutoincInfo *pInfo;
    Table *pSeqTab = pParse->db->aDb[iDb].pSchema->pSeqTab;

    /* Verify that the sqlite_sequence table exists and is an ordinary
    ** rowid table with exactly two columns.
    ** Ticket d8dc2b3a58cd5dc2918a1d4acb 2018-05-23 */
    if( pSeqTab==0
     || !HasRowid(pSeqTab)
     || NEVER(IsVirtual(pSeqTab))
     || pSeqTab->nCol!=2
    ){
      pParse->nErr++;
      pParse->rc = SQLITE_CORRUPT_SEQUENCE;
      return 0;
    }

    pInfo = pToplevel->pAinc;
    while( pInfo && pInfo->pTab!=pTab ){ pInfo = pInfo->pNext; }
    if( pInfo==0 ){
      pInfo = sqlite3DbMallocRawNN(pParse->db, sizeof(*pInfo));
      sqlite3ParserAddCleanup(pToplevel, sqlite3DbFree, pInfo);
      testcase( pParse->earlyCleanup );
      if( pParse->db->mallocFailed ) return 0;
      pInfo->pNext = pToplevel->pAinc;
      pToplevel->pAinc = pInfo;
      pInfo->pTab = pTab;
      pInfo->iDb = iDb;
      pToplevel->nMem++;                  /* Register to hold name of table */
      pInfo->regCtr = ++pToplevel->nMem;  /* Max rowid register */
      pToplevel->nMem +=2;       /* Rowid in sqlite_sequence + orig max val */
    }
    memId = pInfo->regCtr;
  }
  return memId;
}